

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O1

void Dch_AddClausesMux(Dch_Man_t *p,Aig_Obj_t *pNode)

{
  int *piVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int pLits [4];
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  uint local_88;
  uint local_84;
  uint local_80;
  lit local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  Aig_Obj_t *local_68;
  Aig_Obj_t *local_60;
  Aig_Obj_t *local_58;
  ulong local_50;
  Aig_Obj_t *local_48;
  uint local_3c;
  ulong local_38;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                  ,0x32,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
  }
  iVar4 = Aig_ObjIsMuxType(pNode);
  if (iVar4 == 0) {
    __assert_fail("Aig_ObjIsMuxType( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                  ,0x33,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
  }
  local_68 = Aig_ObjRecognizeMux(pNode,&local_48,&local_58);
  pAVar3 = local_58;
  piVar1 = p->pSatVars;
  local_38 = (ulong)(uint)piVar1[*(int *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x24)];
  local_50 = (ulong)(uint)piVar1[*(int *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x24)];
  uVar6 = (uint)local_48 & 1;
  uVar5 = piVar1[local_68->Id] * 2 + 1;
  uVar2 = piVar1[local_68->Id] * 2;
  local_6c = uVar6 + piVar1[*(int *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x24)] * 2;
  local_3c = local_6c ^ 1;
  local_78 = piVar1[pNode->Id] * 2;
  local_88 = uVar5;
  local_84 = local_3c;
  local_80 = local_78;
  if (p->pPars->fPolarFlip != 0) {
    if ((local_68->field_0x18 & 8) != 0) {
      local_88 = uVar2;
    }
    if ((*(byte *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
      local_84 = local_6c;
    }
    if ((pNode->field_0x18 & 8) != 0) {
      local_80 = local_78 | 1;
    }
  }
  local_60 = pNode;
  iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_88,&local_7c);
  if (iVar4 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                  ,0x51,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
  }
  uVar6 = (int)local_38 * 2 | uVar6;
  local_74 = local_78 | 1;
  local_88 = uVar5;
  local_84 = uVar6;
  local_80 = local_74;
  if (p->pPars->fPolarFlip != 0) {
    if ((local_68->field_0x18 & 8) != 0) {
      local_88 = uVar2;
    }
    if ((*(byte *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
      local_84 = uVar6 ^ 1;
    }
    if ((local_60->field_0x18 & 8) != 0) {
      local_80 = local_78;
    }
  }
  iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_88,&local_7c);
  if (iVar4 != 0) {
    uVar5 = (uint)pAVar3 & 1;
    local_70 = uVar5 + (int)local_50 * 2;
    uVar7 = local_70 ^ 1;
    local_80 = local_78;
    local_88 = uVar2;
    local_84 = uVar7;
    if (p->pPars->fPolarFlip != 0) {
      if ((local_68->field_0x18 & 8) != 0) {
        local_88 = uVar2 | 1;
      }
      if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
        local_84 = local_70;
      }
      if ((local_60->field_0x18 & 8) != 0) {
        local_80 = local_74;
      }
    }
    iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_88,&local_7c);
    pAVar3 = local_60;
    if (iVar4 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                    ,0x67,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
    }
    uVar5 = (int)local_50 * 2 | uVar5;
    local_80 = local_74;
    local_88 = uVar2;
    local_84 = uVar5;
    if (p->pPars->fPolarFlip != 0) {
      if ((local_68->field_0x18 & 8) != 0) {
        local_88 = uVar2 | 1;
      }
      if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
        local_84 = uVar5 ^ 1;
      }
      if ((local_60->field_0x18 & 8) != 0) {
        local_80 = local_78;
      }
    }
    iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_88,&local_7c);
    if (iVar4 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                    ,0x72,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
    }
    if ((int)local_38 != (int)local_50) {
      local_80 = local_74;
      local_88 = uVar6;
      local_84 = uVar5;
      if (p->pPars->fPolarFlip != 0) {
        if ((*(byte *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
          local_88 = uVar6 ^ 1;
        }
        if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
          local_84 = uVar5 ^ 1;
        }
        if ((pAVar3->field_0x18 & 8) != 0) {
          local_80 = local_78;
        }
      }
      iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_88,&local_7c);
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                      ,0x8b,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
      }
      local_88 = local_3c;
      local_80 = local_78;
      local_84 = uVar7;
      if (p->pPars->fPolarFlip != 0) {
        if ((*(byte *)(((ulong)local_48 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
          local_88 = local_6c;
        }
        if ((*(byte *)(((ulong)local_58 & 0xfffffffffffffffe) + 0x18) & 8) != 0) {
          local_84 = local_70;
        }
        if ((pAVar3->field_0x18 & 8) != 0) {
          local_80 = local_74;
        }
      }
      iVar4 = sat_solver_addclause(p->pSat,(lit *)&local_88,&local_7c);
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                      ,0x96,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
      }
    }
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchCnf.c"
                ,0x5c,"void Dch_AddClausesMux(Dch_Man_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Addes clauses to the solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Dch_AddClausesMux( Dch_Man_t * p, Aig_Obj_t * pNode )
{
    Aig_Obj_t * pNodeI, * pNodeT, * pNodeE;
    int pLits[4], RetValue, VarF, VarI, VarT, VarE, fCompT, fCompE;

    assert( !Aig_IsComplement( pNode ) );
    assert( Aig_ObjIsMuxType( pNode ) );
    // get nodes (I = if, T = then, E = else)
    pNodeI = Aig_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    // get the variable numbers
    VarF = Dch_ObjSatNum(p,pNode);
    VarI = Dch_ObjSatNum(p,pNodeI);
    VarT = Dch_ObjSatNum(p,Aig_Regular(pNodeT));
    VarE = Dch_ObjSatNum(p,Aig_Regular(pNodeE));
    // get the complementation flags
    fCompT = Aig_IsComplement(pNodeT);
    fCompE = Aig_IsComplement(pNodeE);

    // f = ITE(i, t, e)

    // i' + t' + f
    // i' + t  + f'
    // i  + e' + f
    // i  + e  + f'

    // create four clauses
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 1^fCompT);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 1);
    pLits[1] = toLitCond(VarT, 0^fCompT);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarI, 0);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNodeI->fPhase )               pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );

    // two additional clauses
    // t' & e' -> f'
    // t  & e  -> f 

    // t  + e   + f'
    // t' + e'  + f 

    if ( VarT == VarE )
    {
//        assert( fCompT == !fCompE );
        return;
    }

    pLits[0] = toLitCond(VarT, 0^fCompT);
    pLits[1] = toLitCond(VarE, 0^fCompE);
    pLits[2] = toLitCond(VarF, 1);
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
    pLits[0] = toLitCond(VarT, 1^fCompT);
    pLits[1] = toLitCond(VarE, 1^fCompE);
    pLits[2] = toLitCond(VarF, 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( Aig_Regular(pNodeT)->fPhase )  pLits[0] = lit_neg( pLits[0] );
        if ( Aig_Regular(pNodeE)->fPhase )  pLits[1] = lit_neg( pLits[1] );
        if ( pNode->fPhase )                pLits[2] = lit_neg( pLits[2] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 3 );
    assert( RetValue );
}